

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Printer::Print
          (Printer *this,Message *message,TextGenerator *generator)

{
  bool bVar1;
  Reflection *pRVar2;
  pointer pMVar3;
  iterator iVar4;
  iterator iVar5;
  ulong uVar6;
  size_type sVar7;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  int i;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  const_iterator itr;
  Descriptor *descriptor;
  ArrayInputStream input;
  TextGenerator *in_stack_000000e0;
  Printer *in_stack_000000e8;
  string serialized;
  UnknownFieldSet unknown_fields;
  Reflection *reflection;
  map<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
  *in_stack_fffffffffffffeb8;
  Reflection *in_stack_fffffffffffffec0;
  Reflection *in_stack_fffffffffffffed0;
  void *in_stack_fffffffffffffed8;
  ArrayInputStream *in_stack_fffffffffffffee0;
  MessageLite *in_stack_fffffffffffffee8;
  undefined4 in_stack_ffffffffffffff20;
  int iVar8;
  undefined4 in_stack_ffffffffffffff24;
  ZeroCopyInputStream *in_stack_ffffffffffffff28;
  Reflection *in_stack_ffffffffffffff30;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_b8;
  _Self local_a0;
  _Self local_98;
  Descriptor *local_90;
  string local_58 [8];
  TextGenerator *in_stack_ffffffffffffffb0;
  FieldDescriptor *in_stack_ffffffffffffffb8;
  Reflection *in_stack_ffffffffffffffc0;
  Message *in_stack_ffffffffffffffc8;
  Printer *in_stack_ffffffffffffffd0;
  
  pRVar2 = Message::GetReflection((Message *)in_stack_fffffffffffffec0);
  if (pRVar2 == (Reflection *)0x0) {
    UnknownFieldSet::UnknownFieldSet((UnknownFieldSet *)0x434e1d);
    MessageLite::SerializeAsString_abi_cxx11_(in_stack_fffffffffffffee8);
    std::__cxx11::string::data();
    std::__cxx11::string::size();
    io::ArrayInputStream::ArrayInputStream
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
               (int)((ulong)in_stack_fffffffffffffed0 >> 0x20),(int)in_stack_fffffffffffffed0);
    UnknownFieldSet::ParseFromZeroCopyStream
              ((UnknownFieldSet *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    io::ArrayInputStream::~ArrayInputStream((ArrayInputStream *)0x434e94);
    std::__cxx11::string::~string(local_58);
    PrintUnknownFields((Printer *)serialized._0_8_,(UnknownFieldSet *)in_stack_000000e8,
                       in_stack_000000e0);
    UnknownFieldSet::~UnknownFieldSet((UnknownFieldSet *)in_stack_fffffffffffffec0);
  }
  else {
    local_90 = Message::GetDescriptor((Message *)in_stack_fffffffffffffec0);
    local_98._M_node =
         (_Base_ptr)
         std::
         map<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
         ::find(in_stack_fffffffffffffeb8,(key_type *)0x434f66);
    local_a0._M_node =
         (_Base_ptr)
         std::
         map<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
         ::end(in_stack_fffffffffffffeb8);
    bVar1 = std::operator!=(&local_98,&local_a0);
    if (bVar1) {
      std::
      _Rb_tree_const_iterator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>
                    *)0x434fac);
      pMVar3 = std::
               unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>
               ::operator->((unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>
                             *)0x434fb8);
      (**(code **)(*(long *)pMVar3 + 0x10))(pMVar3,in_RSI,*(byte *)(in_RDI + 4) & 1,in_RDX);
    }
    else {
      Descriptor::full_name_abi_cxx11_(local_90);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
      if (((!bVar1) || ((*(byte *)(in_RDI + 9) & 1) == 0)) ||
         (bVar1 = PrintAny(in_stack_000000e8,(Message *)in_stack_000000e0,
                           (TextGenerator *)input._24_8_), !bVar1)) {
        std::
        vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  *)0x435043);
        Descriptor::options(local_90);
        bVar1 = MessageOptions::map_entry((MessageOptions *)0x435061);
        if (bVar1) {
          Descriptor::field(local_90,0);
          std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       *)in_stack_fffffffffffffec0,(value_type *)in_stack_fffffffffffffeb8);
          Descriptor::field(local_90,1);
          std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       *)in_stack_fffffffffffffec0,(value_type *)in_stack_fffffffffffffeb8);
        }
        else {
          Reflection::ListFields
                    (in_stack_ffffffffffffff30,(Message *)in_stack_ffffffffffffff28,
                     (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
        }
        if ((*(byte *)(in_RDI + 8) & 1) != 0) {
          iVar4 = std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::begin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           *)in_stack_fffffffffffffeb8);
          iVar5 = std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::end((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         *)in_stack_fffffffffffffeb8);
          std::
          sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,google::protobuf::(anonymous_namespace)::FieldIndexSorter>
                    (iVar4._M_current,iVar5._M_current);
        }
        iVar8 = 0;
        while( true ) {
          uVar6 = (ulong)iVar8;
          sVar7 = std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::size(&local_b8);
          if (sVar7 <= uVar6) break;
          in_stack_fffffffffffffed0 = pRVar2;
          std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::operator[](&local_b8,(long)iVar8);
          PrintField(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                     in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
          iVar8 = iVar8 + 1;
        }
        if ((*(byte *)(in_RDI + 7) & 1) == 0) {
          Reflection::GetUnknownFields
                    (in_stack_fffffffffffffec0,(Message *)in_stack_fffffffffffffeb8);
          PrintUnknownFields((Printer *)serialized._0_8_,(UnknownFieldSet *)in_stack_000000e8,
                             in_stack_000000e0);
        }
        std::
        vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   *)in_stack_fffffffffffffed0);
      }
    }
  }
  return;
}

Assistant:

void TextFormat::Printer::Print(const Message& message,
                                TextGenerator* generator) const {
  const Reflection* reflection = message.GetReflection();
  if (!reflection) {
    // This message does not provide any way to describe its structure.
    // Parse it again in an UnknownFieldSet, and display this instead.
    UnknownFieldSet unknown_fields;
    {
      std::string serialized = message.SerializeAsString();
      io::ArrayInputStream input(serialized.data(), serialized.size());
      unknown_fields.ParseFromZeroCopyStream(&input);
    }
    PrintUnknownFields(unknown_fields, generator);
    return;
  }
  const Descriptor* descriptor = message.GetDescriptor();
  auto itr = custom_message_printers_.find(descriptor);
  if (itr != custom_message_printers_.end()) {
    itr->second->Print(message, single_line_mode_, generator);
    return;
  }
  if (descriptor->full_name() == internal::kAnyFullTypeName && expand_any_ &&
      PrintAny(message, generator)) {
    return;
  }
  std::vector<const FieldDescriptor*> fields;
  if (descriptor->options().map_entry()) {
    fields.push_back(descriptor->field(0));
    fields.push_back(descriptor->field(1));
  } else {
    reflection->ListFields(message, &fields);
  }

  if (print_message_fields_in_index_order_) {
    std::sort(fields.begin(), fields.end(), FieldIndexSorter());
  }
  for (int i = 0; i < fields.size(); i++) {
    PrintField(message, reflection, fields[i], generator);
  }
  if (!hide_unknown_fields_) {
    PrintUnknownFields(reflection->GetUnknownFields(message), generator);
  }
}